

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O3

void __thiscall QSaveFile::QSaveFile(QSaveFile *this,QString *name)

{
  QFileDevicePrivate *this_00;
  
  this_00 = (QFileDevicePrivate *)operator_new(0x1e0);
  QFileDevicePrivate::QFileDevicePrivate(this_00);
  (this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QSaveFilePrivate_00697728;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)0x0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.q_ptr = (QObject *)0x0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.parent = (QObject *)0x0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.children.d.d =
       (Data *)0x0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.children.d.ptr =
       (QObject **)0x0;
  this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.children.d.size = 0;
  *(undefined4 *)
   &this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.field_0x30 = 0;
  *(undefined2 *)
   &this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.postedEvents.
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
       = 1;
  QFileDevice::QFileDevice(&this->super_QFileDevice,this_00,(QObject *)0x0);
  (this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&PTR_metaObject_00697778;
  QString::operator=((QString *)
                     &(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d[5].children,
                     name);
  return;
}

Assistant:

QSaveFile::QSaveFile(const QString &name)
    : QFileDevice(*new QSaveFilePrivate, nullptr)
{
    Q_D(QSaveFile);
    d->fileName = name;
}